

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QPainterPath::Element>::erase
          (QPodArrayOps<QPainterPath::Element> *this,Element *b,qsizetype n)

{
  Element *pEVar1;
  long lVar2;
  Element *pEVar3;
  Element *__src;
  
  __src = b + n;
  pEVar1 = (this->super_QArrayDataPointer<QPainterPath::Element>).ptr;
  lVar2 = (this->super_QArrayDataPointer<QPainterPath::Element>).size;
  pEVar3 = pEVar1 + lVar2;
  if (__src == pEVar3 || pEVar1 != b) {
    if (__src != pEVar3) {
      memmove(b,__src,(long)pEVar3 - (long)__src);
      lVar2 = (this->super_QArrayDataPointer<QPainterPath::Element>).size;
    }
  }
  else {
    (this->super_QArrayDataPointer<QPainterPath::Element>).ptr = __src;
  }
  (this->super_QArrayDataPointer<QPainterPath::Element>).size = lVar2 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }